

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_write_string(FILE *f,char *str,char *errmsg)

{
  char *data;
  undefined8 in_RDX;
  FILE *in_RSI;
  size_t n;
  char *in_stack_ffffffffffffffd8;
  uint32_t n_00;
  
  n_00 = (uint32_t)((ulong)in_RDX >> 0x20);
  data = (char *)strlen((char *)in_RSI);
  if ((char *)0xfffffffe < data) {
    mcpl_error((char *)0x1029da);
  }
  mcpl_write_buffer(in_RSI,n_00,data,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

MCPL_LOCAL void mcpl_write_string(FILE* f, const char * str, const char * errmsg)
{
  size_t n = strlen(str);
  if ( n >= 4294967295 )
    mcpl_error("too large string encountered ");
  mcpl_write_buffer(f,(uint32_t)n,str,errmsg);//nb: we don't write the terminating null-char
}